

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

bool slang::matches(string_view str,string_view pattern)

{
  char cVar1;
  string_view pattern_00;
  string_view str_00;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t end;
  size_t i;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff78;
  char *__n;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff88;
  ulong local_40;
  char *local_38;
  char *pcVar6;
  char *pcVar7;
  
  while( true ) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8)
    ;
    if (bVar2) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe8);
      return bVar2;
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8
                        ,0);
    __n = in_stack_ffffffffffffff78._M_str;
    if (*pvVar3 == '*') {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffff88._M_str,in_stack_ffffffffffffff88._M_len,
                         (size_type)__n);
      local_38 = (char *)bVar5._M_len;
      pcVar6 = bVar5._M_str;
      pcVar7 = pcVar6;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffd8);
      if (bVar2) {
        return true;
      }
      local_40 = 0;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe8);
      while( true ) {
        if (sVar4 <= local_40) {
          return false;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_ffffffffffffff88._M_str,in_stack_ffffffffffffff88._M_len,(size_type)__n)
        ;
        str_00._M_str = in_RDI;
        str_00._M_len = (size_t)pcVar7;
        pattern_00._M_str = local_38;
        pattern_00._M_len = (size_t)pcVar6;
        bVar2 = matches(str_00,pattern_00);
        if (bVar2) break;
        local_40 = local_40 + 1;
      }
      return true;
    }
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
    ;
    if (bVar2) {
      return false;
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8
                        ,0);
    cVar1 = *pvVar3;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8
                        ,0);
    if ((cVar1 != *pvVar3) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffd8,0), *pvVar3 != '?')) break;
    in_stack_ffffffffffffff88 =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)
                    in_stack_ffffffffffffff88._M_str,in_stack_ffffffffffffff88._M_len,(size_type)__n
                   );
    in_RDI = (char *)in_stack_ffffffffffffff88._M_len;
    in_stack_ffffffffffffff78 =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)
                    in_stack_ffffffffffffff88._M_str,(size_type)in_RDI,(size_type)__n);
  }
  return false;
}

Assistant:

static bool matches(std::string_view str, std::string_view pattern) {
    while (true) {
        // Empty pattern matches empty string.
        if (pattern.empty())
            return str.empty();

        // If next pattern char is '*' try to match pattern[1..] against
        // all possible tail strings of str to see if at least one succeeds.
        if (pattern[0] == '*') {
            // Simple case: if pattern is just '*' it matches anything.
            pattern = pattern.substr(1);
            if (pattern.empty())
                return true;

            for (size_t i = 0, end = str.size(); i < end; i++) {
                if (matches(str.substr(i), pattern))
                    return true;
            }
            return false;
        }

        // If pattern char isn't '*' then it must consume one character.
        if (str.empty())
            return false;

        // '?' matches any character, otherwise we need exact match.
        if (str[0] != pattern[0] && pattern[0] != '?')
            return false;

        str = str.substr(1);
        pattern = pattern.substr(1);
    }
}